

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O1

void Gia_ManPrintBarBufDrivers(Gia_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  undefined8 uVar3;
  void *__s;
  void *__s_00;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int CountFans [2];
  int CountCrit [2];
  ulong local_48;
  ulong local_40;
  Vec_Int_t *local_38;
  
  __s = (void *)0x0;
  local_40 = 0;
  local_48 = 0;
  uVar2 = p->nObjs;
  uVar7 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar7 = uVar2;
  }
  if (uVar7 != 0) {
    __s = malloc((long)(int)uVar7 * 4);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar2 * 4);
  }
  if (uVar7 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)(int)uVar7 << 2);
  }
  if (__s_00 != (void *)0x0) {
    memset(__s_00,0,(long)(int)uVar2 * 4);
  }
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  iVar9 = p->nObjs;
  local_38 = pVVar4;
  if ((0 < iVar9) && (pGVar6 = p->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    iVar10 = 0;
    uVar12 = 0;
    do {
      uVar11 = *(ulong *)pGVar6;
      uVar8 = (uint)uVar11;
      uVar7 = uVar8 & 0x1fffffff;
      if (((((int)uVar8 < 0) || (uVar7 == 0x1fffffff)) ||
          (uVar7 != ((uint)(uVar11 >> 0x20) & 0x1fffffff))) &&
         ((uVar11 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar8)) {
        if (-1 < (int)uVar8 && (int)(uVar11 & 0x1fffffff) != 0x1fffffff) {
          iVar9 = (int)(-uVar7 + uVar12);
          if ((iVar9 < 0) || ((int)uVar2 <= iVar9)) goto LAB_0084d487;
          piVar5 = (int *)((long)__s_00 + (-uVar7 + uVar12 & 0xffffffff) * 4);
          *piVar5 = *piVar5 + 1;
          uVar7 = *(uint *)&pGVar6->field_0x4 & 0x1fffffff;
          goto joined_r0x0084d1f4;
        }
      }
      else {
joined_r0x0084d1f4:
        uVar7 = (int)uVar12 - uVar7;
        if (((int)uVar7 < 0) || ((int)uVar2 <= (int)uVar7)) {
LAB_0084d487:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar5 = (int *)((long)__s_00 + (ulong)uVar7 * 4);
        *piVar5 = *piVar5 + 1;
      }
      uVar7 = (uint)*(ulong *)pGVar6;
      if (((-1 < (int)uVar7) && (uVar8 = uVar7 & 0x1fffffff, uVar8 != 0x1fffffff)) &&
         (uVar8 == ((uint)(*(ulong *)pGVar6 >> 0x20) & 0x1fffffff))) {
        if (uVar12 != (uVar7 & 0x1fffffff)) {
          iVar9 = (int)(-uVar8 + uVar12);
          if ((iVar9 < 0) || ((int)uVar2 <= iVar9)) goto LAB_0084d42a;
          uVar11 = -uVar8 + uVar12 & 0xffffffff;
          if (*(int *)((long)__s + uVar11 * 4) == 0) {
            *(uint *)((long)__s + uVar11 * 4) = iVar10 + (uint)((uVar7 >> 0x1d & 1) != 0);
            goto LAB_0084d27b;
          }
        }
        piVar5 = (int *)((long)&local_40 + (ulong)(uVar12 != (uVar7 & 0x1fffffff)) * 4);
        *piVar5 = *piVar5 + 1;
        Vec_IntPush(local_38,(int)uVar12);
      }
LAB_0084d27b:
      uVar12 = uVar12 + 1;
      iVar9 = p->nObjs;
      if ((long)iVar9 <= (long)uVar12) break;
      pGVar6 = p->pObjs + uVar12;
      iVar10 = iVar10 + 2;
    } while (p->pObjs != (Gia_Obj_t *)0x0);
  }
  pVVar4 = local_38;
  iVar10 = local_38->nSize;
  if (0 < (long)iVar10) {
    piVar5 = local_38->pArray;
    uVar12 = 0;
    uVar11 = 0;
    if (0 < (int)uVar2) {
      uVar11 = (ulong)uVar2;
    }
    do {
      uVar2 = piVar5[uVar12];
      if (((long)(int)uVar2 < 0) || (iVar9 <= (int)uVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(undefined8 *)(p->pObjs + (int)uVar2);
      uVar7 = (uint)uVar3;
      if ((((int)uVar7 < 0) || (uVar7 = uVar7 & 0x1fffffff, uVar7 == 0x1fffffff)) ||
         (uVar7 != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))) {
        __assert_fail("Gia_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                      ,0xf8,"void Gia_ManPrintBarBufDrivers(Gia_Man_t *)");
      }
      if (uVar11 == uVar12) {
LAB_0084d42a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)((long)__s_00 + uVar12 * 4) != 0) {
        if (iVar9 <= (int)uVar2) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        piVar1 = (int *)((long)&local_48 + (ulong)(uVar2 != uVar7) * 4);
        *piVar1 = *piVar1 + 1;
      }
      uVar12 = uVar12 + 1;
    } while ((long)iVar10 != uVar12);
  }
  printf("Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n",
         local_48 & 0xffffffff,local_40 & 0xffffffff,local_48 >> 0x20,local_40 >> 0x20);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  return;
}

Assistant:

void Gia_ManPrintBarBufDrivers( Gia_Man_t * p )
{
    Vec_Int_t * vMap, * vFan, * vCrits;
    Gia_Obj_t * pObj;
    int i, iFanin, CountCrit[2] = {0}, CountFans[2] = {0};
    // map barbuf drivers into barbuf literals of the first barbuf driven by them
    vMap = Vec_IntStart( Gia_ManObjNum(p) );
    vFan = Vec_IntStart( Gia_ManObjNum(p) );
    vCrits = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
    {
        // count fanouts
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjIsCo(pObj) )
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId0(pObj, i), 1 );
            Vec_IntAddToEntry( vFan, Gia_ObjFaninId1(pObj, i), 1 );
        }
        // count critical barbufs
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0( pObj, i );
            if ( iFanin == 0 || Vec_IntEntry(vMap, iFanin) != 0 )
            {
                CountCrit[(int)(iFanin != 0)]++;
                Vec_IntPush( vCrits, i );
                continue;
            }
            Vec_IntWriteEntry( vMap, iFanin, Abc_Var2Lit(i, Gia_ObjFaninC0(pObj)) );
        }
    }
    // check fanouts of the critical barbufs
    Gia_ManForEachObjVec( vCrits, p, pObj, i )
    {
        assert( Gia_ObjIsBuf(pObj) );
        if ( Vec_IntEntry(vFan, i) == 0 )
            continue;
        iFanin = Gia_ObjFaninId0p( p, pObj );
        CountFans[(int)(iFanin != 0)]++;
    }
    printf( "Detected %d const (out of %d) and %d shared (out of %d) barbufs with fanout.\n", 
        CountFans[0], CountCrit[0], CountFans[1], CountCrit[1] );
    Vec_IntFree( vMap );
    Vec_IntFree( vFan );
    Vec_IntFree( vCrits );
}